

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  const_reference pvVar9;
  long lVar10;
  long lVar11;
  idx_t iVar12;
  long lVar13;
  idx_t iVar14;
  long lVar15;
  long lVar16;
  idx_t iVar17;
  idx_t iVar18;
  bool bVar19;
  value_type rhs_offset_in_row;
  interval_t *lhs_data;
  idx_t entry_idx;
  uchar **rhs_locations;
  idx_t local_80;
  idx_t local_78;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar9;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_80 = 0;
      iVar18 = 0;
      do {
        iVar17 = iVar18;
        if (psVar6 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar6[iVar18];
        }
        iVar12 = iVar17;
        if (psVar7 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar7[iVar17];
        }
        lVar10 = *(long *)(pdVar4 + iVar17 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar10 + (col_idx >> 3))) == 0) {
LAB_00af0ffe:
          *no_match_count = local_78 + 1;
          no_match_sel->sel_vector[local_78] = (sel_t)iVar17;
          local_78 = local_78 + 1;
        }
        else {
          lVar8 = *(long *)(lVar10 + 8 + vVar5);
          lVar15 = iVar12 * 0x10;
          lVar11 = (*(long *)(lVar10 + vVar5) >> 0x20) + lVar8 / 86400000000;
          lVar16 = lVar11 % 0x1e;
          lVar11 = (long)(int)*(long *)(lVar10 + vVar5) + lVar11 / 0x1e;
          lVar13 = (long)*(int *)(pdVar3 + lVar15 + 4) +
                   *(long *)(pdVar3 + lVar15 + 8) / 86400000000;
          lVar10 = lVar13 % 0x1e;
          lVar13 = (long)*(int *)(pdVar3 + lVar15) + lVar13 / 0x1e;
          if ((lVar11 <= lVar13) &&
             ((lVar11 < lVar13 ||
              ((lVar16 <= lVar10 &&
               ((lVar16 < lVar10 ||
                (lVar8 % 86400000000 <= *(long *)(pdVar3 + lVar15 + 8) % 86400000000))))))))
          goto LAB_00af0ffe;
          psVar6[local_80] = (sel_t)iVar17;
          local_80 = local_80 + 1;
        }
        iVar18 = iVar18 + 1;
        if (count == iVar18) {
          return local_80;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_80 = 0;
    iVar17 = 0;
    iVar18 = *no_match_count;
    do {
      iVar12 = iVar17;
      if (psVar6 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar6[iVar17];
      }
      iVar14 = iVar12;
      if (psVar7 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar7[iVar12];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar19 = false;
      }
      else {
        bVar19 = (puVar1[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) == 0;
      }
      if ((bVar19) ||
         (lVar10 = *(long *)(pdVar4 + iVar12 * 8),
         ((uint)*(byte *)(lVar10 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_00af0e53:
        iVar14 = iVar18 + 1;
        *no_match_count = iVar14;
        no_match_sel->sel_vector[iVar18] = (sel_t)iVar12;
      }
      else {
        lVar8 = *(long *)(lVar10 + 8 + vVar5);
        lVar15 = iVar14 * 0x10;
        lVar13 = (*(long *)(lVar10 + vVar5) >> 0x20) + lVar8 / 86400000000;
        lVar11 = lVar13 % 0x1e;
        lVar16 = (long)(int)*(long *)(lVar10 + vVar5) + lVar13 / 0x1e;
        lVar13 = (long)*(int *)(pdVar3 + lVar15 + 4) + *(long *)(pdVar3 + lVar15 + 8) / 86400000000;
        lVar10 = lVar13 % 0x1e;
        lVar13 = (long)*(int *)(pdVar3 + lVar15) + lVar13 / 0x1e;
        if ((lVar16 <= lVar13) &&
           ((lVar16 < lVar13 ||
            ((lVar11 <= lVar10 &&
             ((lVar11 < lVar10 ||
              (lVar8 % 86400000000 <= *(long *)(pdVar3 + lVar15 + 8) % 86400000000))))))))
        goto LAB_00af0e53;
        psVar6[local_80] = (sel_t)iVar12;
        local_80 = local_80 + 1;
        iVar14 = iVar18;
      }
      iVar17 = iVar17 + 1;
      iVar18 = iVar14;
      if (count == iVar17) {
        return local_80;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}